

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::NumSamplesCase::NumSamplesCase
          (NumSamplesCase *this,Context *context,char *name,char *description,FboParams *fboParams)

{
  int iVar1;
  int iVar2;
  
  MultisampleCase::MultisampleCase
            (&this->super_MultisampleCase,context,name,description,0x100,fboParams);
  (this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NumSamplesCase_0214a768;
  this->m_currentIteration = 0;
  iVar1 = tcu::CommandLine::getTestIterationCount
                    (((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_cmdLine);
  iVar2 = 0x10;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  this->m_maxNumIterations = iVar2;
  (this->m_detectedColors).super__Vector_base<tcu::RGBA,_std::allocator<tcu::RGBA>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_detectedColors).super__Vector_base<tcu::RGBA,_std::allocator<tcu::RGBA>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_detectedColors).super__Vector_base<tcu::RGBA,_std::allocator<tcu::RGBA>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

NumSamplesCase::NumSamplesCase (Context& context, const char* name, const char* description, const FboParams& fboParams)
	: MultisampleCase		(context, name, description, 256, fboParams)
	, m_currentIteration	(0)
	, m_maxNumIterations	(getIterationCount(m_testCtx, DEFAULT_MAX_NUM_ITERATIONS))
{
}